

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

int RankWasHinted(pyhanabi_card_knowledge_t *knowledge)

{
  uint __line;
  char *__assertion;
  
  if (knowledge == (pyhanabi_card_knowledge_t *)0x0) {
    __assertion = "knowledge != nullptr";
    __line = 0x52;
  }
  else {
    if (knowledge->knowledge != (void *)0x0) {
      return ~*(uint *)((long)knowledge->knowledge + 0x30) >> 0x1f;
    }
    __assertion = "knowledge->knowledge != nullptr";
    __line = 0x53;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,__line,"int RankWasHinted(pyhanabi_card_knowledge_t *)");
}

Assistant:

int RankWasHinted(pyhanabi_card_knowledge_t* knowledge) {
  REQUIRE(knowledge != nullptr);
  REQUIRE(knowledge->knowledge != nullptr);
  return reinterpret_cast<
             const hanabi_learning_env::HanabiHand::CardKnowledge*>(
             knowledge->knowledge)
      ->RankHinted();
}